

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<ProString_&,_QString>,_ProString_&>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<ProString_&,_QString>,_ProString_&> *this)

{
  int iVar1;
  int iVar2;
  ProString *pPVar3;
  long lVar4;
  long in_FS_OFFSET;
  iterator d;
  QChar *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar3 = (this->a).a;
  if (((this->a).b.d.ptr == (char16_t *)0x0 && (pPVar3->m_string).d.ptr == (char16_t *)0x0) &&
     ((this->b->m_string).d.ptr == (char16_t *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_0027785f;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    iVar1 = pPVar3->m_length;
    lVar4 = (this->a).b.d.size;
    iVar2 = this->b->m_length;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,(long)iVar2 + iVar1 + lVar4,Uninitialized);
    local_20 = (QChar *)(__return_storage_ptr__->d).ptr;
    QConcatenable<QStringBuilder<QStringBuilder<ProString_&,_QString>,_ProString_&>_>::
    appendTo<QChar>(this,&local_20);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_0027785f:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }